

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O0

ContainerMetadata
duckdb::roaring::ContainerMetadata::CreateMetadata
          (uint16_t count,uint16_t array_null,uint16_t array_non_null,uint16_t runs)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ushort in_CX;
  ushort in_DX;
  ushort in_SI;
  unsigned_short in_DI;
  uint16_t bitset_cost;
  uint16_t lowest_run_cost;
  uint16_t lowest_array_cost;
  uint16_t non_null_array_cost;
  uint16_t null_array_cost;
  bool can_use_array;
  bool can_use_run;
  bool can_use_non_null_array;
  bool can_use_null_array;
  bool local_1b;
  ContainerMetadata local_4;
  
  local_1b = in_SI < 0xf8 || in_DX < 0xf8;
  if ((local_1b) || (in_CX < 0x7c)) {
    if (in_SI < 8) {
      uVar2 = in_SI << 1;
    }
    else {
      uVar2 = in_SI + 8;
    }
    if (in_DX < 8) {
      uVar1 = in_DX << 1;
    }
    else {
      uVar1 = in_DX + 8;
    }
    uVar2 = MinValue<unsigned_short>(uVar2,uVar1);
    if (in_CX < 4) {
      uVar1 = in_CX << 2;
    }
    else {
      uVar1 = in_CX * 2 + 8;
    }
    uVar3 = AlignValue<unsigned_short,_(unsigned_short)64>(in_DI);
    uVar4 = MinValue<unsigned_short>(uVar2,uVar1);
    if ((ushort)((uVar3 >> 6) << 3) < uVar4) {
      local_4 = BitsetContainer(0xa0);
    }
    else if (uVar1 < uVar2) {
      local_4 = RunContainer(0xa0);
    }
    else if (in_DX < in_SI) {
      local_4 = ArrayContainer(0xa0,true);
    }
    else {
      local_4 = ArrayContainer(0xa0,true);
    }
  }
  else {
    local_4 = BitsetContainer(0xa0);
  }
  return local_4;
}

Assistant:

ContainerMetadata ContainerMetadata::CreateMetadata(uint16_t count, uint16_t array_null, uint16_t array_non_null,
                                                    uint16_t runs) {
	const bool can_use_null_array = array_null < MAX_ARRAY_IDX;
	const bool can_use_non_null_array = array_non_null < MAX_ARRAY_IDX;

	const bool can_use_run = runs < MAX_RUN_IDX;

	const bool can_use_array = can_use_null_array || can_use_non_null_array;
	if (!can_use_array && !can_use_run) {
		// Can not efficiently encode at all, write it as bitset
		return ContainerMetadata::BitsetContainer(count);
	}
	uint16_t null_array_cost = array_null < COMPRESSED_ARRAY_THRESHOLD
	                               ? array_null * sizeof(uint16_t)
	                               : COMPRESSED_SEGMENT_COUNT + (array_null * sizeof(uint8_t));
	uint16_t non_null_array_cost = array_non_null < COMPRESSED_ARRAY_THRESHOLD
	                                   ? array_non_null * sizeof(uint16_t)
	                                   : COMPRESSED_SEGMENT_COUNT + (array_non_null * sizeof(uint8_t));

	uint16_t lowest_array_cost = MinValue<uint16_t>(null_array_cost, non_null_array_cost);
	uint16_t lowest_run_cost = runs < COMPRESSED_RUN_THRESHOLD ? runs * sizeof(uint32_t)
	                                                           : COMPRESSED_SEGMENT_COUNT + (runs * sizeof(uint16_t));
	uint16_t bitset_cost =
	    (AlignValue<uint16_t, ValidityMask::BITS_PER_VALUE>(count) / ValidityMask::BITS_PER_VALUE) * sizeof(validity_t);
	if (MinValue<uint16_t>(lowest_array_cost, lowest_run_cost) > bitset_cost) {
		// The amount of values is too small, better off using bitset
		// we can detect this at decompression because we know how many values are left
		return ContainerMetadata::BitsetContainer(count);
	}

	if (lowest_array_cost <= lowest_run_cost) {
		if (array_null <= array_non_null) {
			return ContainerMetadata::ArrayContainer(array_null, NULLS);
		} else {
			return ContainerMetadata::ArrayContainer(array_non_null, NON_NULLS);
		}
	} else {
		return ContainerMetadata::RunContainer(runs);
	}
}